

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

size_t drwav__on_write_memory(void *pUserData,void *pDataIn,size_t bytesToWrite)

{
  void *__src;
  void *__dest;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0xce7,"size_t drwav__on_write_memory(void *, const void *, size_t)");
  }
  uVar3 = *(ulong *)((long)pUserData + 0x110);
  uVar1 = *(ulong *)((long)pUserData + 0x118);
  if (uVar3 < uVar1) {
    __assert_fail("pWav->memoryStreamWrite.dataCapacity >= pWav->memoryStreamWrite.currentWritePos",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0xce8,"size_t drwav__on_write_memory(void *, const void *, size_t)");
  }
  if (uVar3 - uVar1 < bytesToWrite) {
    lVar2 = 0x100;
    if (uVar3 != 0) {
      lVar2 = uVar3 * 2;
    }
    lVar4 = uVar1 + bytesToWrite;
    if (bytesToWrite <= lVar2 - uVar1) {
      lVar4 = lVar2;
    }
    __src = (void *)**(undefined8 **)((long)pUserData + 0xf8);
    if (*(code **)((long)pUserData + 0x30) == (code *)0x0) {
      if ((*(code **)((long)pUserData + 0x28) != (code *)0x0) &&
         (*(long *)((long)pUserData + 0x38) != 0)) {
        __dest = (void *)(**(code **)((long)pUserData + 0x28))
                                   (lVar4,*(undefined8 *)((long)pUserData + 0x20));
        if (__dest != (void *)0x0) {
          if (__src != (void *)0x0) {
            memcpy(__dest,__src,uVar3);
            (**(code **)((long)pUserData + 0x38))(__src,*(undefined8 *)((long)pUserData + 0x20));
          }
          goto LAB_00125ac5;
        }
      }
    }
    else {
      __dest = (void *)(**(code **)((long)pUserData + 0x30))
                                 (__src,lVar4,*(undefined8 *)((long)pUserData + 0x20));
      if (__dest != (void *)0x0) {
LAB_00125ac5:
        **(long **)((long)pUserData + 0xf8) = (long)__dest;
        *(long *)((long)pUserData + 0x110) = lVar4;
        uVar1 = *(ulong *)((long)pUserData + 0x118);
        goto LAB_00125ae1;
      }
    }
    bytesToWrite = 0;
  }
  else {
LAB_00125ae1:
    memcpy((void *)(uVar1 + **(long **)((long)pUserData + 0xf8)),pDataIn,bytesToWrite);
    uVar1 = *(long *)((long)pUserData + 0x118) + bytesToWrite;
    *(ulong *)((long)pUserData + 0x118) = uVar1;
    uVar3 = *(ulong *)((long)pUserData + 0x108);
    if (*(ulong *)((long)pUserData + 0x108) < uVar1) {
      *(ulong *)((long)pUserData + 0x108) = uVar1;
      uVar3 = uVar1;
    }
    **(ulong **)((long)pUserData + 0x100) = uVar3;
  }
  return bytesToWrite;
}

Assistant:

static size_t drwav__on_write_memory(void* pUserData, const void* pDataIn, size_t bytesToWrite)
{
    drwav* pWav = (drwav*)pUserData;
    size_t bytesRemaining;

    DRWAV_ASSERT(pWav != NULL);
    DRWAV_ASSERT(pWav->memoryStreamWrite.dataCapacity >= pWav->memoryStreamWrite.currentWritePos);

    bytesRemaining = pWav->memoryStreamWrite.dataCapacity - pWav->memoryStreamWrite.currentWritePos;
    if (bytesRemaining < bytesToWrite) {
        /* Need to reallocate. */
        void* pNewData;
        size_t newDataCapacity = (pWav->memoryStreamWrite.dataCapacity == 0) ? 256 : pWav->memoryStreamWrite.dataCapacity * 2;

        /* If doubling wasn't enough, just make it the minimum required size to write the data. */
        if ((newDataCapacity - pWav->memoryStreamWrite.currentWritePos) < bytesToWrite) {
            newDataCapacity = pWav->memoryStreamWrite.currentWritePos + bytesToWrite;
        }

        pNewData = drwav__realloc_from_callbacks(*pWav->memoryStreamWrite.ppData, newDataCapacity, pWav->memoryStreamWrite.dataCapacity, &pWav->allocationCallbacks);
        if (pNewData == NULL) {
            return 0;
        }

        *pWav->memoryStreamWrite.ppData = pNewData;
        pWav->memoryStreamWrite.dataCapacity = newDataCapacity;
    }

    DRWAV_COPY_MEMORY(((drwav_uint8*)(*pWav->memoryStreamWrite.ppData)) + pWav->memoryStreamWrite.currentWritePos, pDataIn, bytesToWrite);

    pWav->memoryStreamWrite.currentWritePos += bytesToWrite;
    if (pWav->memoryStreamWrite.dataSize < pWav->memoryStreamWrite.currentWritePos) {
        pWav->memoryStreamWrite.dataSize = pWav->memoryStreamWrite.currentWritePos;
    }

    *pWav->memoryStreamWrite.pDataSize = pWav->memoryStreamWrite.dataSize;

    return bytesToWrite;
}